

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cpp
# Opt level: O2

bool __thiscall Gluco::SimpSolver::implied(SimpSolver *this,vec<Gluco::Lit> *c)

{
  int iVar1;
  bool bVar2;
  undefined4 in_EAX;
  CRef CVar3;
  long lVar4;
  bool bVar5;
  undefined4 uStack_38;
  int local_34;
  
  if ((this->super_Solver).trail_lim.sz != 0) {
    __assert_fail("decisionLevel() == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/SimpSolver.cpp"
                  ,0x14b,"bool Gluco::SimpSolver::implied(const vec<Lit> &)");
  }
  _uStack_38 = CONCAT44((this->super_Solver).trail.sz,in_EAX);
  vec<int>::push(&(this->super_Solver).trail_lim,&local_34);
  bVar5 = false;
  for (lVar4 = 0; lVar4 < c->sz; lVar4 = lVar4 + 1) {
    iVar1 = c->data[lVar4].x;
    uStack_38 = CONCAT13((byte)iVar1 & 1 ^ (this->super_Solver).assigns.data[iVar1 >> 1].value,
                         (undefined3)uStack_38);
    bVar2 = lbool::operator==((lbool *)((long)&uStack_38 + 3),(lbool)0x0);
    if (bVar2) goto LAB_004bafcb;
    iVar1 = c->data[lVar4].x;
    uStack_38._0_3_ =
         CONCAT12((byte)iVar1 & 1 ^ (this->super_Solver).assigns.data[iVar1 >> 1].value,
                  (undefined2)uStack_38);
    bVar2 = lbool::operator!=((lbool *)((long)&uStack_38 + 2),(lbool)0x1);
    if (bVar2) {
      iVar1 = c->data[lVar4].x;
      uStack_38._0_2_ =
           CONCAT11((byte)iVar1 & 1 ^ (this->super_Solver).assigns.data[iVar1 >> 1].value,
                    (undefined1)uStack_38);
      bVar2 = lbool::operator==((lbool *)((long)&uStack_38 + 1),(lbool)0x2);
      if (!bVar2) {
        __assert_fail("value(c[i]) == l_Undef",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/SimpSolver.cpp"
                      ,0x153,"bool Gluco::SimpSolver::implied(const vec<Lit> &)");
      }
      Solver::uncheckedEnqueue(&this->super_Solver,(Lit)(c->data[lVar4].x ^ 1),0xffffffff);
    }
  }
  CVar3 = Solver::propagate(&this->super_Solver);
  bVar5 = CVar3 != 0xffffffff;
LAB_004bafcb:
  Solver::cancelUntil(&this->super_Solver,0);
  return bVar5;
}

Assistant:

bool SimpSolver::implied(const vec<Lit>& c)
{
    assert(decisionLevel() == 0);

    trail_lim.push(trail.size());
    for (int i = 0; i < c.size(); i++)
        if (value(c[i]) == l_True){
            cancelUntil(0);
            return false;
        }else if (value(c[i]) != l_False){
            assert(value(c[i]) == l_Undef);
            uncheckedEnqueue(~c[i]);
        }

    bool result = propagate() != CRef_Undef;
    cancelUntil(0);
    return result;
}